

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBlobImpl.cpp
# Opt level: O3

void * __thiscall
Diligent::DataBlobAllocatorAdapter::Allocate
          (DataBlobAllocatorAdapter *this,size_t Size,Char *dbgDescription,char *dbgFileName,
          Int32 dbgLineNumber)

{
  undefined8 uVar1;
  RefCntAutoPtr<Diligent::DataBlobImpl> *this_00;
  DataBlobImpl *pObj;
  string msg;
  undefined1 local_38 [16];
  undefined8 local_28;
  
  if ((this->m_pDataBlob).m_pObject != (DataBlobImpl *)0x0) {
    FormatString<char[91]>
              ((string *)local_38,
               (char (*) [91])
               "The data blob has already been created. The allocator does not support more than one blob."
              );
    DebugAssertionFailed
              ((Char *)local_38._0_8_,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/DataBlobImpl.cpp"
               ,0x72);
    if ((DataBlobImpl *)local_38._0_8_ != (DataBlobImpl *)&stack0xffffffffffffffd8) {
      operator_delete((void *)local_38._0_8_,local_28 + 1);
    }
  }
  this_00 = &this->m_pDataBlob;
  DataBlobImpl::Create((DataBlobImpl *)local_38,(IMemoryAllocator *)0x0,Size,(void *)0x0);
  uVar1 = local_38._0_8_;
  if (this_00->m_pObject != (DataBlobImpl *)local_38._0_8_) {
    local_38._0_8_ = (DataBlobImpl *)0x0;
    RefCntAutoPtr<Diligent::DataBlobImpl>::Release(this_00);
    this_00->m_pObject = (DataBlobImpl *)uVar1;
  }
  RefCntAutoPtr<Diligent::DataBlobImpl>::Release((RefCntAutoPtr<Diligent::DataBlobImpl> *)local_38);
  return (this_00->m_pObject->m_DataBuff).
         super__Vector_base<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
         ._M_impl.super__Vector_impl_data._M_start;
}

Assistant:

void* DataBlobAllocatorAdapter::Allocate(size_t Size, const Char* dbgDescription, const char* dbgFileName, const Int32 dbgLineNumber)
{
    VERIFY(!m_pDataBlob, "The data blob has already been created. The allocator does not support more than one blob.");
    m_pDataBlob = DataBlobImpl::Create(Size);
    return m_pDataBlob->GetDataPtr();
}